

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<(anonymous_namespace)::ns::Project<std::set<(anonymous_namespace)::ns::Value,std::less<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>>
          (type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  bool bVar1;
  int iVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  undefined7 extraout_var;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  iterator this_01;
  system_error *psVar4;
  uint uVar5;
  uint uVar6;
  const_array_range_type cVar7;
  error_code __ec;
  error_code __ec_00;
  undefined1 local_a0 [8];
  undefined1 local_98 [24];
  _Base_ptr p_Stack_80;
  type *local_78;
  _Base_ptr local_70;
  error_code local_68;
  _Base_ptr local_58 [3];
  string_view_type local_40;
  _Link_type __x;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (!bVar1) {
    psVar4 = (system_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(&local_68,conversion_failed);
    local_a0 = (undefined1  [8])(local_98 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Not a ns::Project","");
    __ec_00._4_4_ = 0;
    __ec_00._M_value = local_68._M_value;
    *(undefined ***)(psVar4 + 0x50) = &PTR__json_exception_00b2f248;
    __ec_00._M_cat = local_68._M_cat;
    std::system_error::system_error(psVar4,__ec_00,(string *)local_a0);
    *(undefined8 *)psVar4 = 0xb31b78;
    *(undefined8 *)(psVar4 + 0x50) = 0xb31bb0;
    *(undefined8 *)(psVar4 + 0x20) = 0;
    *(undefined8 *)(psVar4 + 0x28) = 0;
    *(system_error **)(psVar4 + 0x30) = psVar4 + 0x40;
    *(undefined8 *)(psVar4 + 0x38) = 0;
    psVar4[0x40] = (system_error)0x0;
    __cxa_throw(psVar4,&conv_error::typeinfo,conv_error::~conv_error);
  }
  __return_storage_ptr__->version = 1;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->author)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->author).field_2;
  (__return_storage_ptr__->author)._M_string_length = 0;
  (__return_storage_ptr__->author).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->notes)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->notes).field_2;
  (__return_storage_ptr__->notes)._M_string_length = 0;
  (__return_storage_ptr__->notes).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->showNotes = false;
  local_70 = &(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_70;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_70;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = (undefined1  [8])0x7;
  local_98._0_8_ = "version";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])0x7;
    local_98._0_8_ = "version";
    pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                        (string_view_type *)local_a0);
    iVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<int>
                      (pbVar3);
    __return_storage_ptr__->version = iVar2;
  }
  local_a0 = (undefined1  [8])0x4;
  local_98._0_8_ = "name";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])0x4;
    local_98._0_8_ = "name";
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_a0,&__return_storage_ptr__->name);
  }
  local_a0 = (undefined1  [8])&DAT_00000006;
  local_98._0_8_ = "author";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])&DAT_00000006;
    local_98._0_8_ = "author";
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_a0,&__return_storage_ptr__->author);
  }
  local_a0 = (undefined1  [8])&DAT_00000005;
  local_98._0_8_ = "notes";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])&DAT_00000005;
    local_98._0_8_ = "notes";
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_a0,&__return_storage_ptr__->notes);
  }
  local_a0 = (undefined1  [8])0x9;
  local_98._0_8_ = "showNotes";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])0x9;
    local_98._0_8_ = "showNotes";
    pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                        (string_view_type *)local_a0);
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool(pbVar3);
    __return_storage_ptr__->showNotes = bVar1;
  }
  local_a0 = (undefined1  [8])&DAT_00000006;
  local_98._0_8_ = "values";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  local_98._8_8_ = CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    local_40._M_len = 6;
    local_40._M_str = "values";
    this_00 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                         &local_40);
    pbVar3 = this_00;
    while( true ) {
      uVar5 = *(byte *)&pbVar3->field_0 & 0xf;
      uVar6 = uVar5 - 8;
      __x = (_Link_type)(ulong)uVar6;
      if (1 < uVar6) break;
      pbVar3 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                ((long)&pbVar3->field_0 + 8);
    }
    if (uVar5 != 0xe) {
      psVar4 = (system_error *)__cxa_allocate_exception(0x58);
      std::error_code::error_code<jsoncons::conv_errc,void>((error_code *)local_a0,not_vector);
      __ec._0_8_ = (ulong)local_a0 & 0xffffffff;
      *(undefined ***)(psVar4 + 0x50) = &PTR__json_exception_00b2f248;
      __ec._M_cat = (error_category *)local_98._0_8_;
      std::system_error::system_error(psVar4,__ec);
      *(undefined8 *)psVar4 = 0xb31b78;
      *(undefined8 *)(psVar4 + 0x50) = 0xb31bb0;
      *(undefined8 *)(psVar4 + 0x20) = 0;
      *(undefined8 *)(psVar4 + 0x28) = 0;
      *(system_error **)(psVar4 + 0x30) = psVar4 + 0x40;
      *(undefined8 *)(psVar4 + 0x38) = 0;
      psVar4[0x40] = (system_error)0x0;
      __cxa_throw(psVar4,&conv_error::typeinfo,conv_error::~conv_error);
    }
    local_98._16_8_ = local_98;
    local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
    local_98._8_8_ = (type *)0x0;
    local_78 = (type *)0x0;
    p_Stack_80 = (_Base_ptr)local_98._16_8_;
    cVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(this_00);
    this_01 = cVar7.first_._M_current;
    if (this_01._M_current != cVar7.last_._M_current._M_current) {
      do {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
        as<(anonymous_namespace)::ns::Value>((type *)&local_68,this_01._M_current);
        __x = (_Link_type)&local_68;
        std::
        set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
        ::insert((set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                  *)local_a0,(value_type *)&local_68);
        if ((_Base_ptr *)CONCAT44(local_68._4_4_,local_68._M_value) != local_58) {
          __x = (_Link_type)((long)&local_58[0]->_M_color + 1);
          operator_delete((_Base_ptr *)CONCAT44(local_68._4_4_,local_68._M_value),(ulong)__x);
        }
        this_01._M_current = this_01._M_current + 1;
      } while (this_01._M_current != cVar7.last_._M_current._M_current);
    }
    std::
    _Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::_M_erase((_Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                *)(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,__x);
    (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_70
    ;
    (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_70;
    (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    if ((type *)local_98._8_8_ != (type *)0x0) {
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_98._0_4_;
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_98._8_8_;
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)local_98._16_8_;
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           p_Stack_80;
      (((string *)(local_98._8_8_ + 8))->_M_dataplus)._M_p = (pointer)local_70;
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)local_78;
      local_98._8_8_ = local_78;
    }
  }
  return (type *)local_98._8_8_;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }